

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2-gui.cpp
# Opt level: O1

stStateCore * __thiscall TripleBuffer<stStateCore>::get(TripleBuffer<stStateCore> *this)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  long lVar5;
  TParameters *pTVar6;
  TParameters *pTVar7;
  byte bVar8;
  
  bVar8 = 0;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex);
  if (iVar4 == 0) {
    if (this->hasChanged == true) {
      memcpy(&this->out,&this->buffer,0xa0);
      iVar1 = (this->buffer).params.keyPressWidth_samples;
      iVar2 = (this->buffer).params.offsetFromPeak_samples;
      iVar3 = (this->buffer).params.alignWindow_samples;
      (this->out).params.playbackId = (this->buffer).params.playbackId;
      (this->out).params.keyPressWidth_samples = iVar1;
      (this->out).params.offsetFromPeak_samples = iVar2;
      (this->out).params.alignWindow_samples = iVar3;
      std::vector<int,_std::allocator<int>_>::operator=
                (&(this->out).params.valuesClusters,&(this->buffer).params.valuesClusters);
      std::vector<float,_std::allocator<float>_>::operator=
                (&(this->out).params.valuesPNonAlphabetic,
                 &(this->buffer).params.valuesPNonAlphabetic);
      std::vector<float,_std::allocator<float>_>::operator=
                (&(this->out).params.valuesWEnglishFreq,&(this->buffer).params.valuesWEnglishFreq);
      pTVar6 = &(this->buffer).params.cipher;
      pTVar7 = &(this->out).params.cipher;
      for (lVar5 = 0xb; lVar5 != 0; lVar5 = lVar5 + -1) {
        iVar4 = pTVar6->maxClusters;
        pTVar7->minClusters = pTVar6->minClusters;
        pTVar7->maxClusters = iVar4;
        pTVar6 = (TParameters *)((long)pTVar6 + (ulong)bVar8 * -0x10 + 8);
        pTVar7 = (TParameters *)((long)pTVar7 + (ulong)bVar8 * -0x10 + 8);
      }
      (this->out).params.cipher.similarityMismatchSig =
           (this->buffer).params.cipher.similarityMismatchSig;
      std::vector<int,_std::allocator<int>_>::operator=
                (&(this->out).params.cipher.hint,&(this->buffer).params.cipher.hint);
      std::
      vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
      ::operator=(&(this->out).similarityMap,&(this->buffer).similarityMap);
      std::vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>::operator=
                (&(this->out).keyPresses.
                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>,
                 &(this->buffer).keyPresses.
                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>);
      (this->out).keyPresses.nClusters = (this->buffer).keyPresses.nClusters;
      std::
      _Rb_tree<int,_std::pair<const_int,_Cipher::Processor>,_std::_Select1st<std::pair<const_int,_Cipher::Processor>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Cipher::Processor>_>_>
      ::operator=(&(this->out).processors._M_t,&(this->buffer).processors._M_t);
      this->hasChanged = false;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
    return &this->out;
  }
  std::__throw_system_error(iVar4);
}

Assistant:

const T & get() {
        std::lock_guard<std::mutex> lock(mutex);
        if (hasChanged) {
            out = buffer;
            hasChanged = false;
        }

        return out;
    }